

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzmatredstructmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
::TPZMatRedStructMatrix
          (TPZMatRedStructMatrix<TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>,_TPZVerySparseMatrix<double>,_double,_TPZStructMatrixOR<double>_>
           *this)

{
  *(undefined8 *)&this->field_0xb0 = 0x181c310;
  *(undefined4 *)&this->field_0xb8 = 0;
  this->field_0xbc = 1;
  memset(this,0,0xa0);
  TPZStructMatrixT<double>::TPZStructMatrixT
            ((TPZStructMatrixT<double> *)this,&PTR_construction_vtable_104__0181b910);
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)&this->field_0xa0,&PTR_construction_vtable_104__0181b940);
  *(undefined8 *)&this->field_0xb0 = 0x181b898;
  *(undefined8 *)this = 0x181b6d8;
  *(undefined8 *)&this->field_0xa0 = 0x181b798;
  return;
}

Assistant:

TPZMatRedStructMatrix<TStructMatrix,TSparseMatrix,TVar,TPar>::TPZMatRedStructMatrix() : TPZStructMatrixT<TVar>()
{
}